

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_address.cpp
# Opt level: O2

void __thiscall sockpp::inet_address::inet_address(inet_address *this,uint32_t addr,in_port_t port)

{
  (this->super_sock_address)._vptr_sock_address = (_func_int **)&PTR__sock_address_0010dac0;
  (this->addr_).sin_zero[0] = '\0';
  (this->addr_).sin_zero[1] = '\0';
  (this->addr_).sin_zero[2] = '\0';
  (this->addr_).sin_zero[3] = '\0';
  (this->addr_).sin_zero[4] = '\0';
  (this->addr_).sin_zero[5] = '\0';
  (this->addr_).sin_zero[6] = '\0';
  (this->addr_).sin_zero[7] = '\0';
  (this->addr_).sin_family = 2;
  (this->addr_).sin_addr.s_addr =
       addr >> 0x18 | (addr & 0xff0000) >> 8 | (addr & 0xff00) << 8 | addr << 0x18;
  (this->addr_).sin_port = port << 8 | port >> 8;
  return;
}

Assistant:

inet_address::inet_address(uint32_t addr, in_port_t port) {
    addr_.sin_family = AF_INET;
    addr_.sin_addr.s_addr = htonl(addr);
    addr_.sin_port = htons(port);
#if defined(__APPLE__) || defined(BSD)
    addr_.sin_len = (uint8_t)SZ;
#endif
}